

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::SPPParameter::SPPParameter(SPPParameter *this,SPPParameter *from)

{
  void *pvVar1;
  int iVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SPPParameter_0071ef80;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->engine_ = from->engine_;
  iVar2 = from->pool_;
  this->pyramid_height_ = from->pyramid_height_;
  this->pool_ = iVar2;
  return;
}

Assistant:

SPPParameter::SPPParameter(const SPPParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&pyramid_height_, &from.pyramid_height_,
    reinterpret_cast<char*>(&engine_) -
    reinterpret_cast<char*>(&pyramid_height_) + sizeof(engine_));
  // @@protoc_insertion_point(copy_constructor:caffe.SPPParameter)
}